

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

void __thiscall Json::FastWriter::writeValue(FastWriter *this,Value *value)

{
  String *pSVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Json *pJVar4;
  Value *pVVar5;
  PrecisionType precisionType;
  bool value_00;
  LargestUInt value_01;
  LargestInt value_02;
  char cVar6;
  undefined1 in_R8B;
  ArrayIndex index;
  ArrayIndex index_00;
  String *key;
  double value_03;
  String local_70;
  char *str;
  String *local_48;
  char *end;
  
  precisionType = 0x12f3f4;
  switch(*(undefined1 *)&value->bits_) {
  case 0:
    if (this->dropNullPlaceholders_ != false) {
      return;
    }
    std::__cxx11::string::append((char *)&this->document_);
    return;
  case 1:
    pJVar4 = (Json *)Value::asInt64(value);
    valueToString_abi_cxx11_(&local_70,pJVar4,value_02);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case 2:
    pJVar4 = (Json *)Value::asUInt64(value);
    valueToString_abi_cxx11_(&local_70,pJVar4,value_01);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case 3:
    value_03 = Value::asDouble(value);
    valueToString_abi_cxx11_(&local_70,(Json *)0x11,value_03,0,precisionType);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case 4:
    bVar2 = Value::getString(value,&str,&end);
    if (!bVar2) {
      return;
    }
    valueToQuotedStringN_abi_cxx11_
              (&local_70,(Json *)str,(char *)(ulong)(uint)((int)end - (int)str),0,(bool)in_R8B);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case 5:
    bVar2 = Value::asBool(value);
    valueToString_abi_cxx11_(&local_70,(Json *)(ulong)bVar2,value_00);
    std::__cxx11::string::append((string *)&this->document_);
    break;
  case 6:
    cVar6 = (char)this + '\b';
    std::__cxx11::string::push_back(cVar6);
    AVar3 = Value::size(value);
    for (index_00 = 0; AVar3 != index_00; index_00 = index_00 + 1) {
      if (index_00 != 0) {
        std::__cxx11::string::push_back(cVar6);
      }
      pVVar5 = Value::operator[](value,index_00);
      writeValue(this,pVVar5);
    }
    std::__cxx11::string::push_back(cVar6);
    return;
  case 7:
    Value::getMemberNames_abi_cxx11_((Members *)&str,value);
    pSVar1 = &this->document_;
    cVar6 = (char)pSVar1;
    std::__cxx11::string::push_back(cVar6);
    for (key = (String *)str; key != local_48; key = key + 1) {
      if (key != (String *)str) {
        std::__cxx11::string::push_back(cVar6);
      }
      valueToQuotedStringN_abi_cxx11_
                (&local_70,(Json *)(key->_M_dataplus)._M_p,
                 (char *)(ulong)(uint)key->_M_string_length,0,(bool)in_R8B);
      std::__cxx11::string::append((string *)pSVar1);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::append((char *)pSVar1);
      pVVar5 = Value::operator[](value,key);
      writeValue(this,pVVar5);
    }
    std::__cxx11::string::push_back(cVar6);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&str);
  default:
    goto switchD_00110224_default;
  }
  std::__cxx11::string::~string((string *)&local_70);
switchD_00110224_default:
  return;
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}